

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O0

uint8 ecx_prevport(ecx_contextt *context,uint16 slave,uint8 port)

{
  byte bVar1;
  uint8 local_14;
  uint8 aport;
  uint8 pport;
  uint8 port_local;
  uint16 slave_local;
  ecx_contextt *context_local;
  
  bVar1 = context->slavelist[slave].activeports;
  local_14 = port;
  switch(port) {
  case '\0':
    if ((bVar1 & 4) == 0) {
      if ((bVar1 & 2) == 0) {
        if ((bVar1 & 4) != 0) {
          local_14 = '\x03';
        }
      }
      else {
        local_14 = '\x01';
      }
    }
    else {
      local_14 = '\x02';
    }
    break;
  case '\x01':
    if ((bVar1 & 8) == 0) {
      if ((bVar1 & 1) == 0) {
        if ((bVar1 & 4) != 0) {
          local_14 = '\x02';
        }
      }
      else {
        local_14 = '\0';
      }
    }
    else {
      local_14 = '\x03';
    }
    break;
  case '\x02':
    if ((bVar1 & 2) == 0) {
      if ((bVar1 & 8) == 0) {
        if ((bVar1 & 1) != 0) {
          local_14 = '\0';
        }
      }
      else {
        local_14 = '\x03';
      }
    }
    else {
      local_14 = '\x01';
    }
    break;
  case '\x03':
    if ((bVar1 & 1) == 0) {
      if ((bVar1 & 4) == 0) {
        if ((bVar1 & 2) != 0) {
          local_14 = '\x01';
        }
      }
      else {
        local_14 = '\x02';
      }
    }
    else {
      local_14 = '\0';
    }
  }
  return local_14;
}

Assistant:

static uint8 ecx_prevport(ecx_contextt *context, uint16 slave, uint8 port)
{
   uint8 pport = port;
   uint8 aport = context->slavelist[slave].activeports;
   switch(port)
   {
      case 0:
         if(aport & PORTM2)
            pport = 2;
         else if (aport & PORTM1)
            pport = 1;
         else if (aport & PORTM2)
            pport = 3;
         break;
      case 1:
         if(aport & PORTM3)
            pport = 3;
         else if (aport & PORTM0)
            pport = 0;
         else if (aport & PORTM2)
            pport = 2;
         break;
      case 2:
         if(aport & PORTM1)
            pport = 1;
         else if (aport & PORTM3)
            pport = 3;
         else if (aport & PORTM0)
            pport = 0;
         break;
      case 3:
         if(aport & PORTM0)
            pport = 0;
         else if (aport & PORTM2)
            pport = 2;
         else if (aport & PORTM1)
            pport = 1;
         break;
   }      
   return pport;
}